

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

void Llb_MtrPrint(Llb_Mtr_t *p,int fOrder)

{
  char *pcVar1;
  undefined8 uVar2;
  uint local_30;
  int local_2c;
  int iCol;
  int iRow;
  int i;
  int *pOrder;
  int fOrder_local;
  Llb_Mtr_t *p_local;
  
  _iRow = (int *)0x0;
  if (fOrder != 0) {
    _iRow = Llb_MtrFindVarOrder(p);
  }
  for (iCol = 0; iCol < p->nRows; iCol = iCol + 1) {
    if (_iRow == (int *)0x0) {
      local_30 = iCol;
    }
    else {
      local_30 = _iRow[iCol];
    }
    printf("%3d : ",(ulong)local_30);
    printf("%3d ",(ulong)(uint)p->pRowSums[(int)local_30]);
    pcVar1 = Llb_MtrVarName(p,local_30);
    printf("%3s ",pcVar1);
    for (local_2c = 0; local_2c < p->nCols; local_2c = local_2c + 1) {
      uVar2 = 0x20;
      if (p->pMatrix[local_2c][(int)local_30] != '\0') {
        uVar2 = 0x2a;
      }
      printf("%c",uVar2);
    }
    printf("\n");
  }
  if (_iRow != (int *)0x0) {
    free(_iRow);
  }
  return;
}

Assistant:

void Llb_MtrPrint( Llb_Mtr_t * p, int fOrder )
{
    int * pOrder = NULL;
    int i, iRow, iCol;
    if ( fOrder )
        pOrder = Llb_MtrFindVarOrder( p );
    for ( i = 0; i < p->nRows; i++ )
    {
        iRow = pOrder ? pOrder[i] : i;
        printf( "%3d : ", iRow );
        printf( "%3d ", p->pRowSums[iRow] );
        printf( "%3s ", Llb_MtrVarName(p, iRow) );
        for ( iCol = 0; iCol < p->nCols; iCol++ )
            printf( "%c", p->pMatrix[iCol][iRow] ? '*' : ' ' );
        printf( "\n" );
    }
    ABC_FREE( pOrder );
}